

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_mus.cpp
# Opt level: O0

bool midi_processor::process_mus
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  value_type vVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  const_reference pvVar5;
  ulong uVar6;
  size_type sVar7;
  byte *pbVar8;
  reference puVar9;
  uint uVar10;
  midi_event local_228;
  uchar *local_1e8;
  int local_1dc;
  undefined1 local_1d8 [4];
  int delta;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_198;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_190;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_188;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_180;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_178;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_170;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_168;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_160;
  uint local_154;
  uint local_150;
  uint channel;
  uint bytes_to_write;
  event_type type;
  byte local_13c;
  byte local_13b;
  uchar local_13a;
  const_iterator cStack_138;
  uint8_t buffer [4];
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_130;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_128;
  const_iterator end;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_118;
  const_iterator it;
  uchar local_108 [8];
  uint8_t velocity_levels [16];
  uint local_ec;
  undefined1 local_e8 [4];
  uint current_timestamp;
  midi_track track;
  midi_event local_80;
  undefined1 local_40 [8];
  midi_track track_1;
  uint16_t offset;
  uint16_t length;
  midi_container *p_out_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file_local;
  
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,4);
  vVar1 = *pvVar5;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,5);
  track_1.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ = CONCAT11(*pvVar5,vVar1);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,6);
  vVar1 = *pvVar5;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,7);
  track_1.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_2_ = CONCAT11(*pvVar5,vVar1);
  midi_container::initialize(p_out,0,0x59);
  midi_track::midi_track((midi_track *)local_40);
  midi_event::midi_event(&local_80,0,extended,0,mus_default_tempo,5);
  midi_track::add_event((midi_track *)local_40,&local_80);
  midi_event::~midi_event(&local_80);
  midi_event::midi_event
            ((midi_event *)
             &track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,extended,0,end_of_track,2);
  midi_track::add_event
            ((midi_track *)local_40,
             (midi_event *)
             &track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  midi_event::~midi_event
            ((midi_event *)
             &track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  midi_container::add_track(p_out,(midi_track *)local_40);
  midi_track::~midi_track((midi_track *)local_40);
  midi_track::midi_track((midi_track *)local_e8);
  local_ec = 0;
  memset(local_108,0,0x10);
  uVar6 = (ulong)track_1.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_;
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(p_file);
  if ((uVar6 < sVar7) &&
     (uVar4 = (uint)track_1.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_,
     uVar10 = (uint)track_1.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
     sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(p_file),
     (ulong)(long)(int)(uVar4 + uVar10) <= sVar7)) {
    end = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(p_file);
    local_118 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&end,(ulong)track_1.m_events.
                                        super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_);
    cStack_138 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(p_file);
    local_130 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&stack0xfffffffffffffec8,
                            (ulong)track_1.m_events.
                                   super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_);
    local_128 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_130,
                            (ulong)track_1.m_events.
                                   super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
    while (bVar2 = __gnu_cxx::operator!=(&local_118,&local_128), bVar2) {
      _bytes_to_write =
           __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator++(&local_118,0);
      pbVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&bytes_to_write);
      local_13c = *pbVar8;
      if (local_13c == 0x60) break;
      local_154 = local_13c & 0xf;
      if (local_154 == 0xf) {
        local_154 = 9;
      }
      else if (8 < local_154) {
        local_154 = local_154 + 1;
      }
      bVar3 = local_13c & 0x70;
      if ((local_13c & 0x70) == 0) {
        channel = 1;
        bVar2 = __gnu_cxx::operator==(&local_118,&local_128);
        if (bVar2) {
          p_file_local._7_1_ = false;
          goto LAB_0012abee;
        }
        local_160 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator++(&local_118,0);
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_160);
        local_13b = *pbVar8;
        local_13a = '\0';
        local_150 = 2;
      }
      else if (bVar3 == 0x10) {
        channel = 1;
        bVar2 = __gnu_cxx::operator==(&local_118,&local_128);
        if (bVar2) {
          p_file_local._7_1_ = false;
          goto LAB_0012abee;
        }
        local_168 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator++(&local_118,0);
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_168);
        local_13b = *pbVar8;
        if ((local_13b & 0x80) == 0) {
          local_13a = local_108[local_154];
        }
        else {
          bVar2 = __gnu_cxx::operator==(&local_118,&local_128);
          if (bVar2) {
            p_file_local._7_1_ = false;
            goto LAB_0012abee;
          }
          local_170 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator++(&local_118,0);
          puVar9 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*(&local_170);
          local_13a = *puVar9;
          local_108[local_154] = local_13a;
          local_13b = local_13b & 0x7f;
        }
        local_150 = 2;
      }
      else if (bVar3 == 0x20) {
        channel = 6;
        bVar2 = __gnu_cxx::operator==(&local_118,&local_128);
        if (bVar2) {
          p_file_local._7_1_ = false;
          goto LAB_0012abee;
        }
        local_178 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator++(&local_118,0);
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_178);
        local_13a = (uchar)((int)(uint)*pbVar8 >> 1);
        local_13b = *pbVar8 << 7;
        local_150 = 2;
      }
      else if (bVar3 == 0x30) {
        channel = 3;
        bVar2 = __gnu_cxx::operator==(&local_118,&local_128);
        if (bVar2) {
          p_file_local._7_1_ = false;
          goto LAB_0012abee;
        }
        local_180 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator++(&local_118,0);
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_180);
        local_13b = *pbVar8;
        if ((local_13b < 10) || (0xe < local_13b)) {
          p_file_local._7_1_ = false;
          goto LAB_0012abee;
        }
        local_13b = ""[local_13b];
        local_13a = '\x01';
        local_150 = 2;
      }
      else {
        if (bVar3 != 0x40) {
          p_file_local._7_1_ = false;
          goto LAB_0012abee;
        }
        bVar2 = __gnu_cxx::operator==(&local_118,&local_128);
        if (bVar2) {
          p_file_local._7_1_ = false;
          goto LAB_0012abee;
        }
        local_188 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator++(&local_118,0);
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_188);
        local_13b = *pbVar8;
        if (local_13b == 0) {
          channel = 4;
          bVar2 = __gnu_cxx::operator==(&local_118,&local_128);
          if (bVar2) {
            p_file_local._7_1_ = false;
            goto LAB_0012abee;
          }
          local_198 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator++(&local_118,0);
          pbVar8 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*(&local_198);
          local_13b = *pbVar8;
          local_150 = 1;
        }
        else {
          if (9 < local_13b) {
            p_file_local._7_1_ = false;
            goto LAB_0012abee;
          }
          channel = 3;
          local_13b = ""[local_13b];
          bVar2 = __gnu_cxx::operator==(&local_118,&local_128);
          if (bVar2) {
            p_file_local._7_1_ = false;
            goto LAB_0012abee;
          }
          local_190 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator++(&local_118,0);
          puVar9 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*(&local_190);
          local_13a = *puVar9;
          local_150 = 2;
        }
      }
      midi_event::midi_event
                ((midi_event *)local_1d8,(ulong)local_ec,channel,local_154,&local_13b,
                 (ulong)local_150);
      midi_track::add_event((midi_track *)local_e8,(midi_event *)local_1d8);
      midi_event::~midi_event((midi_event *)local_1d8);
      if ((local_13c & 0x80) != 0) {
        local_1e8 = local_128._M_current;
        local_1dc = decode_delta(&local_118,(const_iterator)local_128._M_current);
        if (local_1dc < 0) {
          p_file_local._7_1_ = false;
          goto LAB_0012abee;
        }
        local_ec = local_1dc + local_ec;
      }
    }
    midi_event::midi_event(&local_228,(ulong)local_ec,extended,0,end_of_track,2);
    midi_track::add_event((midi_track *)local_e8,&local_228);
    midi_event::~midi_event(&local_228);
    midi_container::add_track(p_out,(midi_track *)local_e8);
    p_file_local._7_1_ = true;
  }
  else {
    p_file_local._7_1_ = false;
  }
LAB_0012abee:
  it._M_current._4_4_ = 1;
  midi_track::~midi_track((midi_track *)local_e8);
  return p_file_local._7_1_;
}

Assistant:

bool midi_processor::process_mus( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    uint16_t length = p_file[ 4 ] | ( p_file[ 5 ] << 8 );
    uint16_t offset = p_file[ 6 ] | ( p_file[ 7 ] << 8 );

    p_out.initialize( 0, 0x59 );

    {
        midi_track track;
        track.add_event( midi_event( 0, midi_event::extended, 0, mus_default_tempo, _countof( mus_default_tempo ) ) );
        track.add_event( midi_event( 0, midi_event::extended, 0, end_of_track, _countof( end_of_track ) ) );
        p_out.add_track( track );
    }

    midi_track track;

    unsigned current_timestamp = 0;

    uint8_t velocity_levels[ 16 ] = { 0 };

    if ( (size_t)offset >= p_file.size() || (size_t)(offset + length) > p_file.size() )
        return false;

    std::vector<uint8_t>::const_iterator it = p_file.begin() + offset, end = p_file.begin() + offset + length;

    uint8_t buffer[ 4 ];

    while ( it != end )
    {
        buffer[ 0 ] = *it++;
        if ( buffer[ 0 ] == 0x60 ) break;

        midi_event::event_type type;

        unsigned bytes_to_write;

        unsigned channel = buffer[ 0 ] & 0x0F;
        if ( channel == 0x0F ) channel = 9;
        else if ( channel >= 9 ) ++channel;

        switch ( buffer[ 0 ] & 0x70 )
        {
        case 0x00:
            type = midi_event::note_on;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            buffer[ 2 ] = 0;
            bytes_to_write = 2;
            break;

        case 0x10:
            type = midi_event::note_on;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            if ( buffer[ 1 ] & 0x80 )
            {
                if ( it == end ) return false;
                buffer[ 2 ] = *it++;
                velocity_levels[ channel ] = buffer[ 2 ];
                buffer[ 1 ] &= 0x7F;
            }
            else
            {
                buffer[ 2 ] = velocity_levels[ channel ];
            }
            bytes_to_write = 2;
            break;

        case 0x20:
            type = midi_event::pitch_wheel;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            buffer[ 2 ] = buffer[ 1 ] >> 1;
            buffer[ 1 ] <<= 7;
            bytes_to_write = 2;
            break;

        case 0x30:
            type = midi_event::control_change;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            if ( buffer[ 1 ] >= 10 && buffer[ 1 ] <= 14 )
            {
                buffer[ 1 ] = mus_controllers[ buffer[ 1 ] ];
                buffer[ 2 ] = 1;
                bytes_to_write = 2;
            }
            else return false; /*throw exception_io_data( "Unhandled MUS system event" );*/
            break;

        case 0x40:
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            if ( buffer[ 1 ] )
            {
                if ( buffer[ 1 ] < 10 )
                {
                    type = midi_event::control_change;
                    buffer[ 1 ] = mus_controllers[ buffer[ 1 ] ];
                    if ( it == end ) return false;
                    buffer[ 2 ] = *it++;
                    bytes_to_write = 2;
                }
                else return false; /*throw exception_io_data( "Invalid MUS controller change event" );*/
            }
            else
            {
                type = midi_event::program_change;
                if ( it == end ) return false;
                buffer[ 1 ] = *it++;
                bytes_to_write = 1;
            }
            break;

        default:
            return false; /*throw exception_io_data( "Invalid MUS status code" );*/
        }

        track.add_event( midi_event( current_timestamp, type, channel, buffer + 1, bytes_to_write ) );

        if ( buffer[ 0 ] & 0x80 )
        {
            int delta = decode_delta( it, end );
            if ( delta < 0 ) return false; /*throw exception_io_data( "Invalid MUS delta" );*/
            current_timestamp += delta;
        }
    }

    track.add_event( midi_event( current_timestamp, midi_event::extended, 0, end_of_track, _countof( end_of_track ) ) );

    p_out.add_track( track );

    return true;
}